

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void attachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  byte bVar1;
  sqlite3 *db;
  Btree *pBVar2;
  Db *pDVar3;
  char *pcVar4;
  Schema *pSVar5;
  bool bVar6;
  u8 uVar7;
  undefined6 uVar8;
  u8 uVar9;
  u8 uVar10;
  undefined6 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uchar *zUri;
  uchar *z;
  Schema *pSVar15;
  Db *pDVar16;
  char *pcVar17;
  int iDb;
  uint uVar18;
  long lVar19;
  Btree *pBVar20;
  long in_FS_OFFSET;
  char *local_78;
  Btree *pNewBt;
  sqlite3_vfs *pVfs;
  char *zErrDyn;
  uint local_4c;
  char *zErr;
  char *zPath;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  db = context->pOut->db;
  zPath = (char *)0x0;
  zErr = (char *)0x0;
  zErrDyn = (char *)0x0;
  local_4c = 0xaaaaaaaa;
  pVfs = (sqlite3_vfs *)&DAT_aaaaaaaaaaaaaaaa;
  zUri = sqlite3_value_text(*argv);
  z = sqlite3_value_text(argv[1]);
  if (zUri == (uchar *)0x0) {
    zUri = "";
  }
  if (z == (uchar *)0x0) {
    z = "";
  }
  if (((db->init).field_0x6 & 4) == 0) {
    iVar14 = db->nDb;
    if (iVar14 < db->aLimit[7] + 2) {
      iVar13 = 0;
      iDb = 0;
      if (0 < iVar14) {
        iVar13 = iVar14;
        iDb = 0;
      }
      do {
        if (iVar13 == iDb) {
          if (db->aDb == db->aDbStatic) {
            pDVar16 = (Db *)sqlite3DbMallocRawNN(db,0x60);
            if (pDVar16 == (Db *)0x0) goto LAB_0019857e;
            pDVar3 = db->aDb;
            pcVar17 = pDVar3->zDbSName;
            pBVar20 = pDVar3->pBt;
            uVar9 = pDVar3->safety_level;
            uVar10 = pDVar3->bSyncSet;
            uVar11 = *(undefined6 *)&pDVar3->field_0x12;
            pSVar15 = pDVar3->pSchema;
            pcVar4 = pDVar3[1].zDbSName;
            pBVar2 = pDVar3[1].pBt;
            uVar7 = pDVar3[1].bSyncSet;
            uVar8 = *(undefined6 *)&pDVar3[1].field_0x12;
            pSVar5 = pDVar3[1].pSchema;
            pDVar16[1].safety_level = pDVar3[1].safety_level;
            pDVar16[1].bSyncSet = uVar7;
            *(undefined6 *)&pDVar16[1].field_0x12 = uVar8;
            pDVar16[1].pSchema = pSVar5;
            pDVar16[1].zDbSName = pcVar4;
            pDVar16[1].pBt = pBVar2;
            pDVar16->safety_level = uVar9;
            pDVar16->bSyncSet = uVar10;
            *(undefined6 *)&pDVar16->field_0x12 = uVar11;
            pDVar16->pSchema = pSVar15;
            pDVar16->zDbSName = pcVar17;
            pDVar16->pBt = pBVar20;
          }
          else {
            pDVar16 = (Db *)sqlite3DbRealloc(db,db->aDb,(long)iVar14 * 0x20 + 0x20);
            if (pDVar16 == (Db *)0x0) goto LAB_0019857e;
          }
          db->aDb = pDVar16;
          iVar14 = db->nDb;
          pDVar3 = pDVar16 + iVar14;
          pDVar3->safety_level = '\0';
          pDVar3->bSyncSet = '\0';
          *(undefined6 *)&pDVar3->field_0x12 = 0;
          *(Schema **)(&pDVar3->safety_level + 8) = (Schema *)0x0;
          pDVar16[iVar14].zDbSName = (char *)0x0;
          pDVar16[iVar14].pBt = (Btree *)0x0;
          local_4c = db->openFlags;
          iVar13 = sqlite3ParseUri(db->pVfs->zName,(char *)zUri,&local_4c,&pVfs,&zPath,&zErr);
          if (iVar13 != 0) {
            if (iVar13 == 7) {
              sqlite3OomFault(db);
            }
            pcVar17 = zErr;
            sqlite3_result_error(context,zErr,-1);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              sqlite3_free(pcVar17);
              return;
            }
            goto LAB_00198908;
          }
          pDVar16 = pDVar16 + iVar14;
          if ((db->flags >> 0x25 & 1) == 0) {
            uVar18 = (local_4c & 0xfffffff8) + 1;
          }
          else {
            uVar18 = local_4c & 0xfffffffb;
            if ((db->flags >> 0x24 & 1) != 0) {
              uVar18 = local_4c;
            }
          }
          local_4c = uVar18 | 0x100;
          local_78 = zPath;
          iVar14 = sqlite3BtreeOpen(pVfs,zPath,db,&pDVar16->pBt,0,local_4c);
          db->nDb = db->nDb + 1;
          pcVar17 = sqlite3DbStrDup(db,(char *)z);
          pDVar16->zDbSName = pcVar17;
          db->noSharedCache = '\0';
          if (iVar14 == 0x13) {
            zErrDyn = sqlite3MPrintf(db,"database is already attached");
            iVar14 = 1;
          }
          else if (iVar14 == 0) {
            pBVar20 = pDVar16->pBt;
            goto LAB_001984e2;
          }
          pDVar16->safety_level = '\x03';
          goto LAB_001987f9;
        }
        iVar12 = sqlite3DbIsNamed(db,iDb,(char *)z);
        iDb = iDb + 1;
      } while (iVar12 == 0);
      iVar14 = 0;
      zErrDyn = sqlite3MPrintf(db,"database %s is already in use",z);
    }
    else {
      iVar14 = 0;
      zErrDyn = sqlite3MPrintf(db,"too many attached databases - max %d");
    }
    goto LAB_00198550;
  }
  pNewBt = (Btree *)0x0;
  pVfs = sqlite3_vfs_find("memdb");
  if (pVfs == (sqlite3_vfs *)0x0) goto LAB_0019857e;
  iVar14 = sqlite3BtreeOpen(pVfs,"x",db,&pNewBt,0,0x100);
  pBVar20 = pNewBt;
  if (iVar14 == 0) {
    pSVar15 = sqlite3SchemaGet(db,pNewBt);
    if (pSVar15 == (Schema *)0x0) {
      sqlite3BtreeClose(pBVar20);
      iVar14 = 7;
    }
    else {
      bVar1 = (db->init).iDb;
      pDVar16 = db->aDb + bVar1;
      pBVar2 = db->aDb[bVar1].pBt;
      if (pBVar2 != (Btree *)0x0) {
        sqlite3BtreeClose(pBVar2);
      }
      pDVar16->pBt = pBVar20;
      pDVar16->pSchema = pSVar15;
      db->noSharedCache = '\0';
      local_78 = (char *)0x0;
LAB_001984e2:
      pSVar15 = sqlite3SchemaGet(db,pBVar20);
      pDVar16->pSchema = pSVar15;
      iVar14 = 0;
      if (pSVar15 == (Schema *)0x0) {
        iVar14 = 7;
        bVar6 = false;
      }
      else if (pSVar15->file_format == '\0') {
        bVar6 = true;
      }
      else {
        bVar6 = true;
        if (pSVar15->enc != db->enc) {
          bVar6 = false;
          zErrDyn = sqlite3MPrintf(db,
                                   "attached databases must use the same text encoding as main database"
                                  );
          iVar14 = 1;
        }
      }
      sqlite3BtreeEnter(pDVar16->pBt);
      sqlite3PagerLockingMode(pDVar16->pBt->pBt->pPager,(uint)db->dfltLockMode);
      pBVar20 = pDVar16->pBt;
      iVar13 = sqlite3BtreeSecureDelete(db->aDb->pBt,-1);
      sqlite3BtreeSecureDelete(pBVar20,iVar13);
      sqlite3BtreeSetPagerFlags(pDVar16->pBt,(uint)db->flags & 0x38 | 3);
      sqlite3BtreeLeave(pDVar16->pBt);
      pDVar16->safety_level = '\x03';
      if ((bVar6) && (iVar14 = 7, pDVar16->zDbSName != (char *)0x0)) {
        iVar14 = 0;
      }
LAB_001987f9:
      sqlite3_free_filename(local_78);
      if (iVar14 == 0) {
        sqlite3BtreeEnterAll(db);
        (db->init).iDb = '\0';
        *(byte *)&db->mDbFlags = (byte)db->mDbFlags & 0xef;
        iVar14 = 0;
        if (((db->init).field_0x6 & 4) == 0) {
          iVar14 = sqlite3Init(db,&zErrDyn);
        }
        sqlite3BtreeLeaveAll(db);
        if (iVar14 == 0) goto LAB_0019857e;
      }
      if (((db->init).field_0x6 & 4) == 0) {
        lVar19 = (long)db->nDb + -1;
        pBVar20 = db->aDb[lVar19].pBt;
        if (pBVar20 != (Btree *)0x0) {
          sqlite3BtreeClose(pBVar20);
          pDVar16 = db->aDb;
          pDVar16[lVar19].pBt = (Btree *)0x0;
          pDVar16[lVar19].pSchema = (Schema *)0x0;
        }
        sqlite3ResetAllSchemasOfConnection(db);
        db->nDb = (int)lVar19;
        if ((iVar14 == 0xc0a) || (iVar14 == 7)) {
          sqlite3OomFault(db);
          sqlite3DbFree(db,zErrDyn);
          zErrDyn = sqlite3MPrintf(db,"out of memory");
          goto LAB_00198550;
        }
        if (zErrDyn == (char *)0x0) {
          zErrDyn = sqlite3MPrintf(db,"unable to open database: %s",zUri);
          goto LAB_00198550;
        }
LAB_00198555:
        sqlite3_result_error(context,zErrDyn,-1);
        sqlite3DbFree(db,zErrDyn);
      }
      else {
LAB_00198550:
        if (zErrDyn != (char *)0x0) goto LAB_00198555;
      }
      if (iVar14 == 0) goto LAB_0019857e;
    }
  }
  sqlite3_result_error_code(context,iVar14);
LAB_0019857e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00198908:
  __stack_chk_fail();
}

Assistant:

static void attachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  int i;
  int rc = 0;
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zName;
  const char *zFile;
  char *zPath = 0;
  char *zErr = 0;
  unsigned int flags;
  Db *aNew;                 /* New array of Db pointers */
  Db *pNew = 0;             /* Db object for the newly attached database */
  char *zErrDyn = 0;
  sqlite3_vfs *pVfs;

  UNUSED_PARAMETER(NotUsed);
  zFile = (const char *)sqlite3_value_text(argv[0]);
  zName = (const char *)sqlite3_value_text(argv[1]);
  if( zFile==0 ) zFile = "";
  if( zName==0 ) zName = "";

#ifndef SQLITE_OMIT_DESERIALIZE
# define REOPEN_AS_MEMDB(db)  (db->init.reopenMemdb)
#else
# define REOPEN_AS_MEMDB(db)  (0)
#endif

  if( REOPEN_AS_MEMDB(db) ){
    /* This is not a real ATTACH.  Instead, this routine is being called
    ** from sqlite3_deserialize() to close database db->init.iDb and
    ** reopen it as a MemDB */
    Btree *pNewBt = 0;
    pVfs = sqlite3_vfs_find("memdb");
    if( pVfs==0 ) return;
    rc = sqlite3BtreeOpen(pVfs, "x\0", db, &pNewBt, 0, SQLITE_OPEN_MAIN_DB);
    if( rc==SQLITE_OK ){
      Schema *pNewSchema = sqlite3SchemaGet(db, pNewBt);
      if( pNewSchema ){
        /* Both the Btree and the new Schema were allocated successfully.
        ** Close the old db and update the aDb[] slot with the new memdb
        ** values.  */
        pNew = &db->aDb[db->init.iDb];
        if( ALWAYS(pNew->pBt) ) sqlite3BtreeClose(pNew->pBt);
        pNew->pBt = pNewBt;
        pNew->pSchema = pNewSchema;
      }else{
        sqlite3BtreeClose(pNewBt);
        rc = SQLITE_NOMEM;
      }
    }
    if( rc ) goto attach_error;
  }else{
    /* This is a real ATTACH
    **
    ** Check for the following errors:
    **
    **     * Too many attached databases,
    **     * Transaction currently open
    **     * Specified database name already being used.
    */
    if( db->nDb>=db->aLimit[SQLITE_LIMIT_ATTACHED]+2 ){
      zErrDyn = sqlite3MPrintf(db, "too many attached databases - max %d",
        db->aLimit[SQLITE_LIMIT_ATTACHED]
      );
      goto attach_error;
    }
    for(i=0; i<db->nDb; i++){
      assert( zName );
      if( sqlite3DbIsNamed(db, i, zName) ){
        zErrDyn = sqlite3MPrintf(db, "database %s is already in use", zName);
        goto attach_error;
      }
    }

    /* Allocate the new entry in the db->aDb[] array and initialize the schema
    ** hash tables.
    */
    if( db->aDb==db->aDbStatic ){
      aNew = sqlite3DbMallocRawNN(db, sizeof(db->aDb[0])*3 );
      if( aNew==0 ) return;
      memcpy(aNew, db->aDb, sizeof(db->aDb[0])*2);
    }else{
      aNew = sqlite3DbRealloc(db, db->aDb, sizeof(db->aDb[0])*(db->nDb+1) );
      if( aNew==0 ) return;
    }
    db->aDb = aNew;
    pNew = &db->aDb[db->nDb];
    memset(pNew, 0, sizeof(*pNew));

    /* Open the database file. If the btree is successfully opened, use
    ** it to obtain the database schema. At this point the schema may
    ** or may not be initialized.
    */
    flags = db->openFlags;
    rc = sqlite3ParseUri(db->pVfs->zName, zFile, &flags, &pVfs, &zPath, &zErr);
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
      sqlite3_result_error(context, zErr, -1);
      sqlite3_free(zErr);
      return;
    }
    if( (db->flags & SQLITE_AttachWrite)==0 ){
      flags &= ~(SQLITE_OPEN_CREATE|SQLITE_OPEN_READWRITE);
      flags |= SQLITE_OPEN_READONLY;
    }else if( (db->flags & SQLITE_AttachCreate)==0 ){
      flags &= ~SQLITE_OPEN_CREATE;
    }
    assert( pVfs );
    flags |= SQLITE_OPEN_MAIN_DB;
    rc = sqlite3BtreeOpen(pVfs, zPath, db, &pNew->pBt, 0, flags);
    db->nDb++;
    pNew->zDbSName = sqlite3DbStrDup(db, zName);
  }
  db->noSharedCache = 0;
  if( rc==SQLITE_CONSTRAINT ){
    rc = SQLITE_ERROR;
    zErrDyn = sqlite3MPrintf(db, "database is already attached");
  }else if( rc==SQLITE_OK ){
    Pager *pPager;
    pNew->pSchema = sqlite3SchemaGet(db, pNew->pBt);
    if( !pNew->pSchema ){
      rc = SQLITE_NOMEM_BKPT;
    }else if( pNew->pSchema->file_format && pNew->pSchema->enc!=ENC(db) ){
      zErrDyn = sqlite3MPrintf(db,
        "attached databases must use the same text encoding as main database");
      rc = SQLITE_ERROR;
    }
    sqlite3BtreeEnter(pNew->pBt);
    pPager = sqlite3BtreePager(pNew->pBt);
    sqlite3PagerLockingMode(pPager, db->dfltLockMode);
    sqlite3BtreeSecureDelete(pNew->pBt,
                             sqlite3BtreeSecureDelete(db->aDb[0].pBt,-1) );
#ifndef SQLITE_OMIT_PAGER_PRAGMAS
    sqlite3BtreeSetPagerFlags(pNew->pBt,
                      PAGER_SYNCHRONOUS_FULL | (db->flags & PAGER_FLAGS_MASK));
#endif
    sqlite3BtreeLeave(pNew->pBt);
  }
  pNew->safety_level = SQLITE_DEFAULT_SYNCHRONOUS+1;
  if( rc==SQLITE_OK && pNew->zDbSName==0 ){
    rc = SQLITE_NOMEM_BKPT;
  }
  sqlite3_free_filename( zPath );

  /* If the file was opened successfully, read the schema for the new database.
  ** If this fails, or if opening the file failed, then close the file and
  ** remove the entry from the db->aDb[] array. i.e. put everything back the
  ** way we found it.
  */
  if( rc==SQLITE_OK ){
    sqlite3BtreeEnterAll(db);
    db->init.iDb = 0;
    db->mDbFlags &= ~(DBFLAG_SchemaKnownOk);
    if( !REOPEN_AS_MEMDB(db) ){
      rc = sqlite3Init(db, &zErrDyn);
    }
    sqlite3BtreeLeaveAll(db);
    assert( zErrDyn==0 || rc!=SQLITE_OK );
  }
  if( rc ){
    if( ALWAYS(!REOPEN_AS_MEMDB(db)) ){
      int iDb = db->nDb - 1;
      assert( iDb>=2 );
      if( db->aDb[iDb].pBt ){
        sqlite3BtreeClose(db->aDb[iDb].pBt);
        db->aDb[iDb].pBt = 0;
        db->aDb[iDb].pSchema = 0;
      }
      sqlite3ResetAllSchemasOfConnection(db);
      db->nDb = iDb;
      if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ){
        sqlite3OomFault(db);
        sqlite3DbFree(db, zErrDyn);
        zErrDyn = sqlite3MPrintf(db, "out of memory");
      }else if( zErrDyn==0 ){
        zErrDyn = sqlite3MPrintf(db, "unable to open database: %s", zFile);
      }
    }
    goto attach_error;
  }

  return;

attach_error:
  /* Return an error if we get here */
  if( zErrDyn ){
    sqlite3_result_error(context, zErrDyn, -1);
    sqlite3DbFree(db, zErrDyn);
  }
  if( rc ) sqlite3_result_error_code(context, rc);
}